

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

undefined8 __thiscall indigox::Atom::ToString_abi_cxx11_(Atom *this)

{
  ostream *poVar1;
  reference pvVar2;
  long in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  size_type in_stack_fffffffffffffdf8;
  array<float,_3UL> *in_stack_fffffffffffffe00;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,*(ulong *)(in_RSI + 0x40));
  poVar1 = std::operator<<(poVar1," \"");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x48));
  poVar1 = std::operator<<(poVar1,"\" @ (");
  pvVar2 = std::array<float,_3UL>::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,",");
  pvVar2 = std::array<float,_3UL>::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(local_188,",");
  pvVar2 = std::array<float,_3UL>::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

String Atom::ToString() {
    std::stringstream ss;
    ss << idx_ << " \"" << name_ << "\" @ (" << pos_[0] << "," << pos_[1] ;
    ss << "," << pos_[2] << ")";
    return ss.str();
  }